

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall wasm::DataFlow::Graph::doVisitLoop(Graph *this,Loop *curr)

{
  mapped_type pEVar1;
  Node *other_00;
  Node *this_00;
  bool bVar2;
  bool bVar3;
  mapped_type *ppEVar4;
  size_t sVar5;
  Node *pNVar6;
  reference ppNVar7;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *pvVar8;
  mapped_type *this_01;
  Type type;
  reference state;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *pvVar9;
  reference this_02;
  pointer pNVar10;
  reference ppNVar11;
  Node **node;
  iterator __end4;
  iterator __begin4;
  Locals *__range4;
  Node **value;
  iterator __end5;
  iterator __begin5;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *__range5;
  size_type j;
  Node *curr_1;
  vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *other;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  Node *proper;
  Node *var;
  bool needPhi;
  uint local_94;
  Index i_1;
  mapped_type *breaks;
  size_type firstNodeFromLoop;
  Locals vars;
  uint local_60;
  Index i;
  size_t numLocals;
  Locals previous;
  Expression *oldParent;
  Loop *curr_local;
  Graph *this_local;
  
  pEVar1 = this->parent;
  previous.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)curr;
  ppEVar4 = std::
            unordered_map<wasm::Expression_*,_wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
            ::operator[](&this->expressionParentMap,
                         (key_type *)
                         &previous.
                          super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  *ppEVar4 = pEVar1;
  this->parent = (Expression *)curr;
  bVar2 = isInUnreachable(this);
  if (!bVar2) {
    bVar2 = IString::is(&(curr->name).super_IString);
    if (bVar2) {
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                 &numLocals,&this->locals);
      sVar5 = Function::getNumLocals(this->func);
      for (local_60 = 0; local_60 < sVar5; local_60 = local_60 + 1) {
        vars.super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)Function::getLocalType(this->func,local_60);
        pNVar6 = makeVar(this,(Type)vars.
                                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppNVar7 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                  operator[](&this->locals,(ulong)local_60);
        *ppNVar7 = pNVar6;
      }
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                 &firstNodeFromLoop,&this->locals);
      pvVar8 = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
               std::
               vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
               ::size(&this->nodes);
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
      this_01 = std::
                unordered_map<wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>_>_>
                ::operator[](&this->breakStates,&curr->name);
      for (local_94 = 0; local_94 < sVar5; local_94 = local_94 + 1) {
        type = Function::getLocalType(this->func,local_94);
        bVar2 = isRelevantType(this,type);
        if (bVar2) {
          bVar2 = false;
          ppNVar7 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                    operator[]((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                *)&firstNodeFromLoop,(ulong)local_94);
          pNVar6 = *ppNVar7;
          ppNVar7 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                    operator[]((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                *)&numLocals,(ulong)local_94);
          other_00 = *ppNVar7;
          __end3 = std::
                   vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                   ::begin(this_01);
          other = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                  std::
                  vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>
                  ::end(this_01);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_*,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
                                             *)&other), bVar3) {
            state = __gnu_cxx::
                    __normal_iterator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_*,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
                    ::operator*(&__end3);
            bVar3 = isInUnreachable(this,state);
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              __assert_fail("!isInUnreachable(other)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/dataflow/graph.h"
                            ,0x14e,"Node *wasm::DataFlow::Graph::doVisitLoop(Loop *)");
            }
            ppNVar7 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                      operator[](state,(ulong)local_94);
            this_00 = *ppNVar7;
            bVar3 = Node::operator!=(this_00,pNVar6);
            if ((bVar3) && (bVar3 = Node::operator!=(this_00,other_00), bVar3)) {
              bVar2 = true;
              break;
            }
            __gnu_cxx::
            __normal_iterator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_*,_std::vector<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>,_std::allocator<std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>_>_>
            ::operator++(&__end3);
          }
          __range5 = pvVar8;
          if (!bVar2) {
            for (; pvVar9 = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                             *)std::
                               vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                               ::size(&this->nodes), __range5 < pvVar9;
                __range5 = (vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            *)((long)&(__range5->
                                      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 1)) {
              this_02 = std::
                        vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
                        ::operator[](&this->nodes,(size_type)__range5);
              pNVar10 = std::
                        unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>
                        ::get(this_02);
              __end5 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                       ::begin(&pNVar10->values);
              value = (Node **)std::
                               vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                               ::end(&pNVar10->values);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                                                 *)&value), bVar2) {
                ppNVar11 = __gnu_cxx::
                           __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                           ::operator*(&__end5);
                if (*ppNVar11 == pNVar6) {
                  *ppNVar11 = other_00;
                }
                __gnu_cxx::
                __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                ::operator++(&__end5);
              }
            }
            __end4 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                     begin(&this->locals);
            node = (Node **)std::
                            vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                            ::end(&this->locals);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                                               *)&node), bVar2) {
              ppNVar11 = __gnu_cxx::
                         __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
                         ::operator*(&__end4);
              if (*ppNVar11 == pNVar6) {
                *ppNVar11 = other_00;
              }
              __gnu_cxx::
              __normal_iterator<wasm::DataFlow::Node_**,_std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>_>
              ::operator++(&__end4);
            }
          }
        }
      }
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::~vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                 &firstNodeFromLoop);
      std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::~vector
                ((vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *)
                 &numLocals);
    }
    else {
      Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->body);
    }
  }
  return &this->bad;
}

Assistant:

Node* doVisitLoop(Loop* curr) {
    auto* oldParent = parent;
    expressionParentMap[curr] = oldParent;
    parent = curr;
    // As in Souper's LLVM extractor, we avoid loop phis, as we don't want
    // our traces to represent a value that differs across loop iterations.
    // For example,
    //   %b = block
    //   %x = phi %b, 1, %y
    //   %y = phi %b, 2, %x
    //   %z = eq %x %y
    //   infer %z
    // Here %y refers to the previous iteration's %x.
    // To do this, we set all locals to a Var at the loop entry, then process
    // the inside of the loop. When that is done, we can see if a phi was
    // actually needed for each local. If it was, we leave the Var (it
    // represents an unknown value; analysis stops there), and if not, we
    // can replace the Var with the fixed value.
    // TODO: perhaps some more general uses of DataFlow will want loop phis?
    // TODO: optimize stuff here
    if (isInUnreachable()) {
      return &bad; // none of this matters
    }
    if (!curr->name.is()) {
      visit(curr->body);
      return &bad; // no phis are possible
    }
    auto previous = locals;
    auto numLocals = func->getNumLocals();
    for (Index i = 0; i < numLocals; i++) {
      locals[i] = makeVar(func->getLocalType(i));
    }
    auto vars = locals; // all the Vars we just created
    // We may need to replace values later - only new nodes added from
    // here are relevant.
    auto firstNodeFromLoop = nodes.size();
    // Process the loop body.
    visit(curr->body);
    // Find all incoming paths.
    auto& breaks = breakStates[curr->name];
    // Phis are possible, check for them.
    for (Index i = 0; i < numLocals; i++) {
      if (!isRelevantType(func->getLocalType(i))) {
        continue;
      }
      bool needPhi = false;
      // We replaced the proper value with a Var. If it's still that
      // Var - or it's the original proper value, which can happen with
      // constants - on all incoming paths, then a phi is not needed.
      auto* var = vars[i];
      auto* proper = previous[i];
      for (auto& other : breaks) {
        assert(!isInUnreachable(other));
        auto& curr = *(other[i]);
        if (curr != *var && curr != *proper) {
          // A phi would be necessary here.
          needPhi = true;
          break;
        }
      }
      if (needPhi) {
        // Nothing to do - leave the Vars, the loop phis are
        // unknown values to us.
      } else {
        // Undo the Var for this local: In every new node added for
        // the loop body, replace references to the Var with the
        // previous value (the value that is all we need instead of a phi).
        for (auto j = firstNodeFromLoop; j < nodes.size(); j++) {
          for (auto*& value : nodes[j].get()->values) {
            if (value == var) {
              value = proper;
            }
          }
        }
        // Also undo in the current local state, which is flowing out
        // of the loop.
        for (auto*& node : locals) {
          if (node == var) {
            node = proper;
          }
        }
      }
    }
    return &bad;
  }